

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::ResetMarks(HeapInfo *this,ResetMarkFlags flags)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallFinalizableHeapBlock *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_9;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar3;
  
  for (lVar3 = 0x78; lVar3 != 0xa878; lVar3 = lVar3 + 0x380) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ResetMarks
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3),flags);
  }
  for (lVar3 = 0; lVar3 != 0x6580; lVar3 = lVar3 + 0x380) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ResetMarks
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar3),flags);
  }
  LargeHeapBucket::ResetMarks(&this->largeObjectBucket,flags);
  if ((flags & ResetMarkFlags_InThreadImplicitRoots) != ResetMarkFlags_HeapEnumeration) {
    for (pSVar1 = &this->newLeafHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>
        ; pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        pSVar1 = &SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                            ((SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)pSVar1)->
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots(pSVar1);
    }
    for (pSVar1 = &this->newNormalHeapBlockList->
                   super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
        pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        pSVar1 = &SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                            ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)pSVar1)->
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots(pSVar1);
    }
    for (pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                  this->newNormalWithBarrierHeapBlockList;
        pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                 SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                            pSVar1)) {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots(pSVar1);
    }
    for (pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                  this->newFinalizableWithBarrierHeapBlockList;
        pSVar1 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        pSVar1 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                 SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                           ((SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *
                            )pSVar1)) {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots(pSVar1);
    }
    for (this_00 = this->newFinalizableHeapBlockList;
        this_00 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
        this_00 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_00))
    {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots
                ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_00);
    }
    for (pSVar2 = &this->newMediumLeafHeapBlockList->
                   super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
        pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
        pSVar2 = &SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                            ((SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)pSVar2)->
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::MarkImplicitRoots(pSVar2);
    }
    for (pSVar2 = &this->newMediumNormalHeapBlockList->
                   super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
        pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
        pSVar2 = &SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                            ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)pSVar2)->
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::MarkImplicitRoots(pSVar2);
    }
    for (pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                  this->newMediumNormalWithBarrierHeapBlockList;
        pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
        pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                 SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                            pSVar2)) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::MarkImplicitRoots(pSVar2);
    }
    for (pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                  this->newMediumFinalizableWithBarrierHeapBlockList;
        pSVar2 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
        pSVar2 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                 SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::
                 GetNextBlock((SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>
                               *)pSVar2)) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::MarkImplicitRoots(pSVar2);
    }
    for (this_01 = this->newMediumFinalizableHeapBlockList;
        this_01 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
        this_01 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_01)
        ) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::MarkImplicitRoots
                ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_01);
    }
  }
  return;
}

Assistant:

void
HeapInfo::ResetMarks(ResetMarkFlags flags)
{
    for (uint i=0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ResetMarks(flags);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i=0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ResetMarks(flags);
    }
#endif

    largeObjectBucket.ResetMarks(flags);

#if ENABLE_CONCURRENT_GC
    if ((flags & ResetMarkFlags_ScanImplicitRoot) != 0)
    {
        HeapBlockList::ForEach(newLeafHeapBlockList, [flags](SmallLeafHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

        HeapBlockList::ForEach(newNormalHeapBlockList, [flags](SmallNormalHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

#ifdef RECYCLER_WRITE_BARRIER
        HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [flags](SmallNormalWithBarrierHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

        HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [flags](SmallFinalizableWithBarrierHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });
#endif

        HeapBlockList::ForEach(newFinalizableHeapBlockList, [flags](SmallNormalHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

        HeapBlockList::ForEach(newMediumLeafHeapBlockList, [flags](MediumLeafHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

        HeapBlockList::ForEach(newMediumNormalHeapBlockList, [flags](MediumNormalHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

#ifdef RECYCLER_WRITE_BARRIER
        HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [flags](MediumNormalWithBarrierHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });

        HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [flags](MediumFinalizableWithBarrierHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });
#endif
        HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [flags](MediumNormalHeapBlock * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });
    }
#endif
}